

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageWriterJPG.cpp
# Opt level: O1

boolean irr::video::jpeg_empty_output_buffer(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  long lVar3;
  
  pjVar1 = cinfo->dest;
  lVar3 = (*(code *)**(undefined8 **)pjVar1[1].next_output_byte)
                    (pjVar1[1].next_output_byte,&pjVar1[1].free_in_buffer,0x1000);
  if (lVar3 != 0x1000) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x26;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1->next_output_byte = (JOCTET *)&pjVar1[1].free_in_buffer;
  pjVar1->free_in_buffer = 0x1000;
  return 1;
}

Assistant:

static boolean jpeg_empty_output_buffer(j_compress_ptr cinfo)
{
	mem_dest_ptr dest = (mem_dest_ptr)cinfo->dest;

	// for now just exit upon file error
	if (dest->file->write(dest->buffer, OUTPUT_BUF_SIZE) != OUTPUT_BUF_SIZE)
		ERREXIT(cinfo, JERR_FILE_WRITE);

	dest->pub.next_output_byte = dest->buffer;
	dest->pub.free_in_buffer = OUTPUT_BUF_SIZE;

	return TRUE;
}